

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMS_CONTEXT_DATA_Unmarshal(TPMS_CONTEXT_DATA *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = TPM2B_DIGEST_Unmarshal(&target->integrity,buffer,size);
  if (TVar1 != 0) {
    return TVar1;
  }
  TVar1 = TPM2B_CONTEXT_SENSITIVE_Unmarshal(&target->encrypted,buffer,size);
  return TVar1;
}

Assistant:

TPM_RC
TPMS_CONTEXT_DATA_Unmarshal(TPMS_CONTEXT_DATA *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->integrity), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_CONTEXT_SENSITIVE_Unmarshal((TPM2B_CONTEXT_SENSITIVE *)&(target->encrypted), buffer, size);
    return result;
}